

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>
__thiscall
anon_unknown.dwarf_16ac71::BuildSystemImpl::createNode
          (BuildSystemImpl *this,StringRef name,bool isImplicit)

{
  char cVar1;
  StringRef name_00;
  StringRef name_01;
  StringRef name_02;
  StringRef local_20;
  
  local_20.Length = name.Length;
  name_00.Length = name.Data;
  local_20.Data = name_00.Length;
  if (local_20.Length != 0) {
    if (name_00.Length[local_20.Length - 1] == '/') {
      name_00.Data = (char *)this;
      llbuild::buildsystem::BuildNode::makeDirectory(name_00);
      return (__uniq_ptr_data<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>,_true,_true>
              )(__uniq_ptr_data<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>,_true,_true>
                )this;
    }
    cVar1 = llvm::StringRef::operator[](&local_20,0);
    if ((cVar1 == '<') && (cVar1 = llvm::StringRef::back(&local_20), cVar1 == '>')) {
      name_01.Length = (size_t)local_20.Data;
      name_01.Data = (char *)this;
      llbuild::buildsystem::BuildNode::makeVirtual(name_01);
      return (__uniq_ptr_data<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>,_true,_true>
              )(__uniq_ptr_data<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>,_true,_true>
                )this;
    }
  }
  name_02.Length = (size_t)local_20.Data;
  name_02.Data = (char *)this;
  llbuild::buildsystem::BuildNode::makePlain(name_02);
  return (__uniq_ptr_data<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>,_true,_true>
          )(__uniq_ptr_data<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<BuildNode>
BuildSystemImpl::createNode(StringRef name, bool isImplicit) {
  if (name.endswith("/")) {
    return BuildNode::makeDirectory(name);
  }

  if (!name.empty() && name[0] == '<' && name.back() == '>') {
    return BuildNode::makeVirtual(name);
  }

  return BuildNode::makePlain(name);
}